

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

void add_zeros_and_len_padding(uchar *output,size_t output_len,size_t data_len)

{
  byte local_29;
  uchar i;
  size_t padding_len;
  size_t data_len_local;
  size_t output_len_local;
  uchar *output_local;
  
  for (local_29 = 1; (ulong)local_29 < output_len - data_len; local_29 = local_29 + 1) {
    output[data_len + local_29 + -1] = '\0';
  }
  output[output_len - 1] = (uchar)(output_len - data_len);
  return;
}

Assistant:

static void add_zeros_and_len_padding( unsigned char *output,
                                       size_t output_len, size_t data_len )
{
    size_t padding_len = output_len - data_len;
    unsigned char i = 0;

    for( i = 1; i < padding_len; i++ )
        output[data_len + i - 1] = 0x00;
    output[output_len - 1] = (unsigned char) padding_len;
}